

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTable.cpp
# Opt level: O1

bool __thiscall
SymbolTable::addEquation
          (SymbolTable *this,wstring *name,uint file,uint section,wstring *replacement)

{
  pointer pwVar1;
  pointer pEVar2;
  pointer pEVar3;
  bool bVar4;
  uint uVar5;
  mapped_type *pmVar6;
  uint uVar7;
  SymbolKey key;
  Equation equation;
  key_type local_a0;
  undefined1 local_78 [32];
  _Alloc_hider local_58;
  wchar_t local_48 [4];
  uint local_38;
  uint local_34;
  
  bVar4 = isValidSymbolName(name);
  if ((!bVar4) || (bVar4 = symbolExists(this,name,file,section), bVar4)) {
    bVar4 = false;
  }
  else {
    pwVar1 = (name->_M_dataplus)._M_p;
    uVar7 = 0xffffffff;
    uVar5 = 0xffffffff;
    if ((*pwVar1 == L'@') && (uVar7 = 0xffffffff, uVar5 = file, pwVar1[1] == L'@')) {
      uVar7 = section;
    }
    local_a0.name._M_dataplus._M_p = (pointer)&local_a0.name.field_2;
    std::__cxx11::wstring::_M_construct<wchar_t*>
              ((wstring *)&local_a0,pwVar1,pwVar1 + name->_M_string_length);
    pEVar2 = (this->equations).
             super__Vector_base<SymbolTable::Equation,_std::allocator<SymbolTable::Equation>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pEVar3 = (this->equations).
             super__Vector_base<SymbolTable::Equation,_std::allocator<SymbolTable::Equation>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    local_a0.file = uVar5;
    local_a0.section = uVar7;
    pmVar6 = std::
             map<SymbolKey,_SymbolTable::SymbolInfo,_std::less<SymbolKey>,_std::allocator<std::pair<const_SymbolKey,_SymbolTable::SymbolInfo>_>_>
             ::operator[](&this->symbols,&local_a0);
    pmVar6->type = EquationSymbol;
    pmVar6->index = ((long)pEVar3 - (long)pEVar2 >> 3) * -0x71c71c71c71c71c7;
    pwVar1 = (name->_M_dataplus)._M_p;
    local_78._0_8_ = local_78 + 0x10;
    std::__cxx11::wstring::_M_construct<wchar_t*>
              ((wstring *)local_78,pwVar1,pwVar1 + name->_M_string_length);
    pwVar1 = (replacement->_M_dataplus)._M_p;
    local_58._M_p = local_48;
    std::__cxx11::wstring::_M_construct<wchar_t*>
              ((wstring *)&local_58,pwVar1,pwVar1 + replacement->_M_string_length);
    local_38 = uVar5;
    local_34 = uVar7;
    std::vector<SymbolTable::Equation,_std::allocator<SymbolTable::Equation>_>::push_back
              (&this->equations,(value_type *)local_78);
    if (local_58._M_p != local_48) {
      operator_delete(local_58._M_p);
    }
    if ((undefined1 *)local_78._0_8_ != local_78 + 0x10) {
      operator_delete((void *)local_78._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_a0.name._M_dataplus._M_p != &local_a0.name.field_2) {
      operator_delete(local_a0.name._M_dataplus._M_p);
    }
    bVar4 = true;
  }
  return bVar4;
}

Assistant:

bool SymbolTable::addEquation(const std::wstring& name, unsigned int file, unsigned int section, std::wstring& replacement)
{
	if (isValidSymbolName(name) == false)
		return false;

	if (symbolExists(name,file,section))
		return false;
	
	setFileSectionValues(name,file,section);

	SymbolKey key = { name, file, section };
	SymbolInfo value = { EquationSymbol, equations.size() };
	symbols[key] = value;

	Equation equation = { name, replacement, file, section };
	equations.push_back(equation);
	return true;
}